

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# turbopacking32.h
# Opt level: O3

void packforblock23(uint32_t base,uint32_t **pin,uint8_t **pw)

{
  uint32_t uVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  uint32_t uVar7;
  uint32_t uVar8;
  uint32_t uVar9;
  uint32_t uVar10;
  uint32_t uVar11;
  uint32_t uVar12;
  uint32_t uVar13;
  uint32_t uVar14;
  uint32_t uVar15;
  uint32_t uVar16;
  uint32_t uVar17;
  uint32_t uVar18;
  uint32_t uVar19;
  uint32_t uVar20;
  uint32_t uVar21;
  uint32_t uVar22;
  uint32_t uVar23;
  uint32_t uVar24;
  uint32_t uVar25;
  uint32_t uVar26;
  uint32_t uVar27;
  uint32_t uVar28;
  uint32_t uVar29;
  uint32_t uVar30;
  uint32_t *puVar31;
  ulong *puVar32;
  
  puVar31 = *pin;
  uVar1 = puVar31[2];
  uVar2 = puVar31[3];
  uVar3 = puVar31[4];
  uVar4 = puVar31[5];
  uVar5 = puVar31[6];
  uVar6 = puVar31[7];
  uVar7 = puVar31[8];
  uVar8 = puVar31[9];
  uVar9 = puVar31[10];
  uVar10 = puVar31[0xb];
  uVar11 = puVar31[0xc];
  uVar12 = puVar31[0xd];
  uVar13 = puVar31[0xe];
  uVar14 = puVar31[0xf];
  uVar15 = puVar31[0x10];
  uVar16 = puVar31[0x11];
  uVar17 = puVar31[0x12];
  uVar18 = puVar31[0x13];
  uVar19 = puVar31[0x14];
  uVar20 = puVar31[0x15];
  uVar21 = puVar31[0x16];
  uVar22 = puVar31[0x17];
  uVar23 = puVar31[0x18];
  uVar24 = puVar31[0x19];
  uVar25 = puVar31[0x1a];
  uVar26 = puVar31[0x1b];
  uVar27 = puVar31[0x1c];
  uVar28 = puVar31[0x1d];
  uVar29 = puVar31[0x1e];
  uVar30 = puVar31[0x1f];
  puVar32 = (ulong *)*pw;
  *puVar32 = (ulong)(uVar1 - base) << 0x2e |
             (ulong)(puVar31[1] - base) << 0x17 | (ulong)(*puVar31 - base);
  puVar32[1] = (ulong)(uVar4 - base) << 0x33 | (ulong)(uVar3 - base) << 0x1c |
               (ulong)(uVar2 - base) << 5 | (ulong)(uVar1 - base >> 0x12);
  puVar32[2] = (ulong)(uVar7 - base) << 0x38 | (ulong)(uVar6 - base) << 0x21 |
               (ulong)(uVar5 - base) << 10 | (ulong)(uVar4 - base >> 0xd);
  puVar32[3] = (ulong)(uVar10 - base) << 0x3d | (ulong)(uVar9 - base) << 0x26 |
               (ulong)(uVar8 - base) << 0xf | (ulong)(uVar7 - base >> 8);
  puVar32[4] = (ulong)(uVar12 - base) << 0x2b |
               (ulong)(uVar11 - base) << 0x14 | (ulong)(uVar10 - base >> 3);
  puVar32[5] = (ulong)(uVar15 - base) << 0x30 | (ulong)(uVar14 - base) << 0x19 |
               (ulong)(uVar13 - base) << 2 | (ulong)(uVar12 - base >> 0x15);
  puVar32[6] = (ulong)(uVar18 - base) << 0x35 | (ulong)(uVar17 - base) << 0x1e |
               (ulong)(uVar16 - base) << 7 | (ulong)(uVar15 - base >> 0x10);
  puVar32[7] = (ulong)(uVar21 - base) << 0x3a | (ulong)(uVar20 - base) << 0x23 |
               (ulong)(uVar19 - base) << 0xc | (ulong)(uVar18 - base >> 0xb);
  puVar32[8] = (ulong)(uVar24 - base) << 0x3f | (ulong)(uVar23 - base) << 0x28 |
               (ulong)(uVar22 - base) << 0x11 | (ulong)(uVar21 - base >> 6);
  puVar32[9] = (ulong)(uVar26 - base) << 0x2d |
               (ulong)(uVar25 - base) << 0x16 | (ulong)(uVar24 - base >> 1);
  puVar32[10] = (ulong)(uVar29 - base) << 0x32 | (ulong)(uVar28 - base) << 0x1b |
                (ulong)(uVar27 - base) << 4 | (ulong)(uVar26 - base >> 0x13);
  puVar32[0xb] = (ulong)(uVar30 - base) << 9 | (ulong)(uVar29 - base >> 0xe);
  *pin = puVar31 + 0x20;
  *pw = *pw + 0x5c;
  return;
}

Assistant:

static void packforblock23(const uint32_t base, const uint32_t **pin,
                           uint8_t **pw) {
  uint64_t *pw64 = *(uint64_t **)pw;
  const uint32_t *in = *pin;
  /* we are going to touch  12 64-bit words */
  uint64_t w0;
  uint64_t w1;
  uint64_t w2;
  uint64_t w3;
  uint64_t w4;
  uint64_t w5;
  uint64_t w6;
  uint64_t w7;
  uint64_t w8;
  uint64_t w9;
  uint64_t w10;
  uint64_t w11;
  w0 = (uint64_t)(in[0] - base);
  w0 |= (uint64_t)(in[1] - base) << 23;
  w0 |= (uint64_t)(in[2] - base) << 46;
  w1 = (uint64_t)(in[2] - base) >> 18;
  w1 |= (uint64_t)(in[3] - base) << 5;
  w1 |= (uint64_t)(in[4] - base) << 28;
  w1 |= (uint64_t)(in[5] - base) << 51;
  w2 = (uint64_t)(in[5] - base) >> 13;
  w2 |= (uint64_t)(in[6] - base) << 10;
  w2 |= (uint64_t)(in[7] - base) << 33;
  w2 |= (uint64_t)(in[8] - base) << 56;
  w3 = (uint64_t)(in[8] - base) >> 8;
  w3 |= (uint64_t)(in[9] - base) << 15;
  w3 |= (uint64_t)(in[10] - base) << 38;
  w3 |= (uint64_t)(in[11] - base) << 61;
  w4 = (uint64_t)(in[11] - base) >> 3;
  w4 |= (uint64_t)(in[12] - base) << 20;
  w4 |= (uint64_t)(in[13] - base) << 43;
  w5 = (uint64_t)(in[13] - base) >> 21;
  w5 |= (uint64_t)(in[14] - base) << 2;
  w5 |= (uint64_t)(in[15] - base) << 25;
  w5 |= (uint64_t)(in[16] - base) << 48;
  w6 = (uint64_t)(in[16] - base) >> 16;
  w6 |= (uint64_t)(in[17] - base) << 7;
  w6 |= (uint64_t)(in[18] - base) << 30;
  w6 |= (uint64_t)(in[19] - base) << 53;
  w7 = (uint64_t)(in[19] - base) >> 11;
  w7 |= (uint64_t)(in[20] - base) << 12;
  w7 |= (uint64_t)(in[21] - base) << 35;
  w7 |= (uint64_t)(in[22] - base) << 58;
  w8 = (uint64_t)(in[22] - base) >> 6;
  w8 |= (uint64_t)(in[23] - base) << 17;
  w8 |= (uint64_t)(in[24] - base) << 40;
  w8 |= (uint64_t)(in[25] - base) << 63;
  w9 = (uint64_t)(in[25] - base) >> 1;
  w9 |= (uint64_t)(in[26] - base) << 22;
  w9 |= (uint64_t)(in[27] - base) << 45;
  w10 = (uint64_t)(in[27] - base) >> 19;
  w10 |= (uint64_t)(in[28] - base) << 4;
  w10 |= (uint64_t)(in[29] - base) << 27;
  w10 |= (uint64_t)(in[30] - base) << 50;
  w11 = (uint64_t)(in[30] - base) >> 14;
  w11 |= (uint64_t)(in[31] - base) << 9;
  pw64[0] = w0;
  pw64[1] = w1;
  pw64[2] = w2;
  pw64[3] = w3;
  pw64[4] = w4;
  pw64[5] = w5;
  pw64[6] = w6;
  pw64[7] = w7;
  pw64[8] = w8;
  pw64[9] = w9;
  pw64[10] = w10;
  pw64[11] = w11;
  *pin += 32; /* we consumed 32 32-bit integers */
  *pw += 92;  /* we used up 92 output bytes */
}